

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesVFManagementSetVFTelemetryModeExp
          (zes_vf_handle_t hVFhandle,zes_vf_info_util_exp_flags_t flags,ze_bool_t enable)

{
  zes_pfnVFManagementSetVFTelemetryModeExp_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnVFManagementSetVFTelemetryModeExp_t pfnSetVFTelemetryModeExp;
  ze_bool_t enable_local;
  zes_vf_info_util_exp_flags_t flags_local;
  zes_vf_handle_t hVFhandle_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->VFManagementExp).pfnSetVFTelemetryModeExp;
    if (p_Var1 == (zes_pfnVFManagementSetVFTelemetryModeExp_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hVFhandle_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hVFhandle_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hVFhandle_local._4_4_ = (*p_Var1)(hVFhandle,flags,enable);
    }
  }
  else {
    hVFhandle_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hVFhandle_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesVFManagementSetVFTelemetryModeExp(
    zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the component.
    zes_vf_info_util_exp_flags_t flags,             ///< [in] utilization flags to enable or disable. May be 0 or a valid
                                                    ///< combination of ::zes_vf_info_util_exp_flag_t.
    ze_bool_t enable                                ///< [in] Enable utilization telemetry.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnVFManagementSetVFTelemetryModeExp_t pfnSetVFTelemetryModeExp = [&result] {
        auto pfnSetVFTelemetryModeExp = ze_lib::context->zesDdiTable.load()->VFManagementExp.pfnSetVFTelemetryModeExp;
        if( nullptr == pfnSetVFTelemetryModeExp ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnSetVFTelemetryModeExp;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnSetVFTelemetryModeExp( hVFhandle, flags, enable );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnSetVFTelemetryModeExp = ze_lib::context->zesDdiTable.load()->VFManagementExp.pfnSetVFTelemetryModeExp;
    if( nullptr == pfnSetVFTelemetryModeExp ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnSetVFTelemetryModeExp( hVFhandle, flags, enable );
    #endif
}